

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O3

_Bool av1_resize_and_extend_frame_nonnormative
                (YV12_BUFFER_CONFIG *src,YV12_BUFFER_CONFIG *dst,int bd,int num_planes)

{
  int length;
  int length_00;
  int in_stride;
  int olength;
  int olength_00;
  int out_stride;
  uint8_t *input;
  uint8_t *output;
  _Bool _Var1;
  int iVar2;
  uint16_t *memblk;
  uint16_t *otmp;
  uint16_t *input_00;
  uint16_t *output_00;
  uint16_t *puVar3;
  ulong uVar4;
  long lVar5;
  uint16_t *puVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  _Bool _Var10;
  undefined1 auVar11 [16];
  
  if (0 < num_planes) {
    uVar4 = 3;
    if ((uint)num_planes < 3) {
      uVar4 = (ulong)(uint)num_planes;
    }
    uVar7 = 0;
    _Var10 = false;
    do {
      lVar8 = (ulong)(uVar7 != 0) * 4;
      input = src->store_buf_adr[uVar7 - 4];
      length = *(int *)((long)src->store_buf_adr + lVar8 + -0x30);
      lVar5 = (long)length;
      length_00 = *(int *)((long)src->store_buf_adr + lVar8 + -0x38);
      in_stride = *(int *)((long)src->store_buf_adr + lVar8 + -0x28);
      output = dst->store_buf_adr[uVar7 - 4];
      olength = *(int *)((long)dst->store_buf_adr + lVar8 + -0x30);
      olength_00 = *(int *)((long)dst->store_buf_adr + lVar8 + -0x38);
      lVar9 = (long)olength_00;
      out_stride = *(int *)((long)dst->store_buf_adr + lVar8 + -0x28);
      if ((src->flags & 8) == 0) {
        _Var1 = av1_resize_plane(input,length,length_00,in_stride,output,olength,olength_00,
                                 out_stride);
        if (!_Var1) {
          return _Var10;
        }
      }
      else {
        memblk = (uint16_t *)aom_malloc(lVar5 * 2 * lVar9);
        iVar2 = length;
        if (length < length_00) {
          iVar2 = length_00;
        }
        otmp = (uint16_t *)aom_malloc((long)iVar2 * 2);
        input_00 = (uint16_t *)aom_malloc(lVar5 * 2);
        output_00 = (uint16_t *)aom_malloc((long)olength * 2);
        auVar11._0_4_ = -(uint)((int)((ulong)memblk >> 0x20) == 0 && (int)memblk == 0);
        auVar11._4_4_ = -(uint)((int)otmp == 0 && (int)((ulong)otmp >> 0x20) == 0);
        auVar11._8_4_ = -(uint)((int)((ulong)input_00 >> 0x20) == 0 && (int)input_00 == 0);
        auVar11._12_4_ = -(uint)((int)output_00 == 0 && (int)((ulong)output_00 >> 0x20) == 0);
        iVar2 = movmskps((int)output_00,auVar11);
        if (iVar2 == 0) {
          if (0 < length) {
            puVar6 = (uint16_t *)((long)input * 2);
            puVar3 = memblk;
            do {
              highbd_resize_multistep(puVar6,length_00,puVar3,olength_00,otmp,bd);
              puVar3 = puVar3 + lVar9;
              puVar6 = puVar6 + in_stride;
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
          }
          if (0 < olength_00) {
            lVar8 = 0;
            puVar6 = memblk;
            do {
              if (0 < length) {
                lVar5 = 0;
                puVar3 = puVar6;
                do {
                  input_00[lVar5] = *puVar3;
                  lVar5 = lVar5 + 1;
                  puVar3 = puVar3 + lVar9;
                } while (length != (int)lVar5);
              }
              highbd_resize_multistep(input_00,length,output_00,olength,otmp,bd);
              if (0 < olength) {
                puVar3 = (uint16_t *)((long)(output + lVar8) * 2);
                lVar5 = 0;
                do {
                  *puVar3 = output_00[lVar5];
                  lVar5 = lVar5 + 1;
                  puVar3 = puVar3 + out_stride;
                } while (olength != (int)lVar5);
              }
              lVar8 = lVar8 + 1;
              puVar6 = puVar6 + 1;
            } while (lVar8 != lVar9);
          }
        }
        aom_free(memblk);
        aom_free(otmp);
        aom_free(input_00);
        aom_free(output_00);
      }
      uVar7 = uVar7 + 1;
      _Var10 = uVar4 <= uVar7;
    } while (uVar7 != uVar4);
  }
  aom_extend_frame_borders_c(dst,num_planes);
  return true;
}

Assistant:

bool av1_resize_and_extend_frame_nonnormative(const YV12_BUFFER_CONFIG *src,
                                              YV12_BUFFER_CONFIG *dst, int bd,
                                              int num_planes) {
  // TODO(dkovalev): replace YV12_BUFFER_CONFIG with aom_image_t

  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  for (int i = 0; i < AOMMIN(num_planes, MAX_MB_PLANE); ++i) {
    const int is_uv = i > 0;
#if CONFIG_AV1_HIGHBITDEPTH
    if (src->flags & YV12_FLAG_HIGHBITDEPTH) {
      highbd_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                          src->crop_widths[is_uv], src->strides[is_uv],
                          dst->buffers[i], dst->crop_heights[is_uv],
                          dst->crop_widths[is_uv], dst->strides[is_uv], bd);
    } else if (!av1_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                                 src->crop_widths[is_uv], src->strides[is_uv],
                                 dst->buffers[i], dst->crop_heights[is_uv],
                                 dst->crop_widths[is_uv],
                                 dst->strides[is_uv])) {
      return false;
    }
#else
    (void)bd;
    if (!av1_resize_plane(src->buffers[i], src->crop_heights[is_uv],
                          src->crop_widths[is_uv], src->strides[is_uv],
                          dst->buffers[i], dst->crop_heights[is_uv],
                          dst->crop_widths[is_uv], dst->strides[is_uv]))
      return false;
#endif
  }
  aom_extend_frame_borders(dst, num_planes);
  return true;
}